

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::
     anon_unknown_5::protobuf_AssignDescriptors(void)

{
  string local_30;
  
  AddDescriptors();
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"google/protobuf/compiler/plugin.proto","");
  internal::AssignDescriptors
            (&local_30,(MigrationSchema *)schemas,(Message **)file_default_instances,
             (uint32 *)TableStruct::offsets,(MessageFactory *)0x0,
             (Metadata *)&(anonymous_namespace)::file_level_metadata,(EnumDescriptor **)0x0,
             (ServiceDescriptor **)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void protobuf_AssignDescriptors() {
  AddDescriptors();
  ::google::protobuf::MessageFactory* factory = NULL;
  AssignDescriptors(
      "google/protobuf/compiler/plugin.proto", schemas, file_default_instances, TableStruct::offsets, factory,
      file_level_metadata, NULL, NULL);
}